

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O0

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  double dVar1;
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_5;
  Mat m_6;
  float *ptr_3;
  int q_2;
  int j;
  int i_4;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  int i_2;
  float *ssptr;
  float *ptr_2;
  int i_3;
  float *ssptr_1;
  float *sptr;
  int p;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  allocator_type *in_stack_fffffffffffff1e0;
  void **ppvVar2;
  size_type in_stack_fffffffffffff1e8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff1f0;
  undefined8 in_stack_fffffffffffff1f8;
  undefined4 in_stack_fffffffffffff200;
  float fVar3;
  float in_stack_fffffffffffff204;
  int in_stack_fffffffffffff208;
  int in_stack_fffffffffffff20c;
  undefined8 in_stack_fffffffffffff210;
  Mat *in_stack_fffffffffffff218;
  Mat *in_stack_fffffffffffff220;
  int in_stack_fffffffffffff230;
  Option *in_stack_fffffffffffff238;
  bool local_c99;
  bool local_c29;
  int local_c10;
  float local_c0c;
  int local_c00;
  int local_bfc;
  void *local_bf8;
  int *local_bf0;
  ulong local_be8;
  undefined4 local_be0;
  long *local_bd8;
  int local_bd0;
  int local_bcc;
  int local_bc8;
  undefined4 local_bc4;
  undefined4 local_bc0;
  ulong local_bb8;
  undefined8 local_bb0;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined4 local_b98;
  long local_b90;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined8 local_b70;
  long local_b68;
  int local_b60;
  int local_b5c;
  int local_b58;
  int local_b54;
  int local_b50;
  int local_b4c;
  reference local_b48;
  vector<int,_std::allocator<int>_> local_b38;
  float local_b20;
  int local_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined4 local_b08;
  undefined4 uStack_b04;
  undefined4 uStack_b00;
  undefined4 uStack_afc;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  int local_ad4;
  void *local_ad0;
  int *local_ac8;
  ulong local_ac0;
  undefined4 local_ab8;
  long *local_ab0;
  int local_aa8;
  int local_aa4;
  int local_aa0;
  undefined4 local_a9c;
  int local_a98;
  long local_a90;
  int local_a84;
  int local_a80;
  int local_a7c;
  undefined8 local_a78;
  undefined8 local_a70;
  undefined8 local_a68;
  undefined4 local_a60;
  long *local_a58;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined8 local_a38;
  float *local_a30;
  undefined8 local_a28;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined4 local_a10;
  long local_a08;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined8 local_9e8;
  float *local_9e0;
  int local_9d4;
  undefined8 local_9d0;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined4 local_9b8;
  long *local_9b0;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined8 local_990;
  float *local_988;
  undefined8 local_980;
  undefined8 local_978;
  undefined8 local_970;
  undefined4 local_968;
  long *local_960;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  undefined8 local_940;
  float *local_938;
  int local_92c;
  int local_928;
  float local_924;
  undefined4 *local_920;
  int *local_918;
  long local_910;
  undefined4 local_908;
  long *local_900;
  undefined4 local_8f8;
  int local_8f4;
  int local_8f0;
  undefined4 local_8ec;
  int local_8e8;
  long local_8e0;
  int local_8d4;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  long *local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined8 local_890;
  float *local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined4 local_868;
  long local_860;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined8 local_840;
  float *local_838;
  int local_82c;
  int local_828;
  void *local_818;
  int *local_810;
  ulong local_808;
  undefined4 local_800;
  long *local_7f8;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  undefined4 local_7e4;
  int local_7e0;
  long local_7d8;
  int local_7cc;
  long local_7c8;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  undefined8 *local_7b0;
  long *local_7a8;
  int local_794;
  void **local_790;
  undefined4 **local_788;
  void **local_780;
  undefined4 **local_778;
  void **local_770;
  undefined1 local_765;
  int local_764;
  void **local_760;
  void **local_758;
  undefined1 local_74d;
  int local_74c;
  undefined8 *local_740;
  undefined1 local_735;
  int local_734;
  undefined4 **local_730;
  undefined8 *local_728;
  undefined1 local_71d;
  int local_71c;
  undefined8 *local_710;
  undefined1 local_705;
  int local_704;
  undefined4 **local_700;
  undefined8 *local_6f8;
  undefined1 local_6ed;
  int local_6ec;
  void **local_6e8;
  undefined8 *local_6e0;
  undefined1 local_6d5;
  int local_6d4;
  void **local_6d0;
  undefined8 *local_6c8;
  undefined1 local_6bd;
  int local_6bc;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_658;
  undefined8 *local_648;
  undefined8 *local_638;
  undefined8 *local_628;
  undefined8 *local_618;
  undefined8 *local_608;
  undefined4 **local_5f8;
  undefined8 *local_5e8;
  void **local_5d8;
  void **local_5c8;
  void **local_5b8;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_588;
  int local_57c;
  undefined4 *local_578;
  int local_570;
  undefined4 local_56c;
  undefined4 **local_568;
  void **local_560;
  void **local_558;
  int local_54c;
  void **local_548;
  undefined4 **local_540;
  void **local_538;
  undefined4 **local_530;
  void **local_528;
  long local_520;
  undefined4 local_514;
  long local_510;
  float *local_508;
  undefined4 local_4fc;
  int local_4f8;
  int local_4f4;
  undefined8 *local_4f0;
  long *local_4e8;
  undefined4 local_4dc;
  ulong local_4d8;
  float *local_4d0;
  undefined4 local_4c4;
  int local_4c0;
  int local_4bc;
  undefined8 *local_4b8;
  long *local_4b0;
  undefined4 local_4a4;
  ulong local_4a0;
  float *local_498;
  undefined4 local_48c;
  int local_488;
  int local_484;
  undefined8 *local_480;
  long *local_478;
  undefined4 local_46c;
  long local_468;
  float *local_460;
  undefined4 local_454;
  int local_450;
  int local_44c;
  undefined8 *local_448;
  long local_440;
  undefined4 local_434;
  long local_430;
  float *local_428;
  undefined4 local_41c;
  int local_418;
  int local_414;
  undefined8 *local_410;
  long *local_408;
  undefined4 local_3fc;
  long local_3f8;
  float *local_3f0;
  undefined4 local_3e4;
  int local_3e0;
  int local_3dc;
  undefined8 *local_3d8;
  long local_3d0;
  undefined4 local_3c4;
  long local_3c0;
  long local_3b8;
  undefined4 local_3ac;
  int local_3a8;
  int local_3a4;
  undefined8 *local_3a0;
  long *local_398;
  undefined4 local_38c;
  ulong local_388;
  void *local_380;
  undefined4 local_374;
  void **local_368;
  undefined4 local_35c;
  long local_358;
  undefined4 local_34c;
  long local_348;
  undefined4 local_33c;
  long local_338;
  undefined4 local_32c;
  long local_328;
  undefined4 local_31c;
  long local_318;
  undefined4 local_30c;
  long local_308;
  undefined4 local_2fc;
  long local_2f8;
  undefined4 local_2ec;
  long local_2e8;
  int local_2d0;
  undefined4 local_2cc;
  void **local_2c8;
  int local_2b0;
  undefined4 local_2ac;
  void **local_2a8;
  int local_290;
  undefined4 local_28c;
  void **local_288;
  undefined8 *local_268;
  int local_250;
  undefined4 local_24c;
  undefined4 **local_248;
  undefined8 *local_228;
  undefined8 *local_208;
  undefined8 *local_1e8;
  undefined8 *local_1c8;
  undefined8 *local_1a8;
  undefined8 *local_188;
  undefined4 *local_60;
  void *local_40;
  void *local_30;
  void *local_20;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_7b4 = *(int *)((long)in_RSI + 0x2c);
  local_7b8 = (int)in_RSI[6];
  local_7bc = (int)in_RSI[7];
  local_7c8 = in_RSI[2];
  local_7cc = local_7b4 * local_7b8;
  local_790 = &local_818;
  local_818 = (void *)0x0;
  local_810 = (int *)0x0;
  local_808 = 0;
  local_800 = 0;
  local_7f8 = (long *)0x0;
  local_7f0 = 0;
  local_7ec = 0;
  local_7e8 = 0;
  local_7e4 = 0;
  local_7e0 = 0;
  local_7d8 = 0;
  local_7b0 = in_RDX;
  local_7a8 = in_RSI;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff204,in_stack_fffffffffffff200),
              (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),(int)in_stack_fffffffffffff1f8,
              (int)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8,
              (Allocator *)in_stack_fffffffffffff1e0);
  local_770 = &local_818;
  if (local_818 != (void *)0x0) {
    local_538 = local_770;
  }
  local_c29 = local_818 == (void *)0x0 || local_7d8 * local_7e0 == 0;
  if (local_c29) {
    local_794 = -100;
    local_828 = 1;
    goto LAB_0102fa24;
  }
  for (local_82c = 0; local_82c < local_7bc; local_82c = local_82c + 1) {
    local_6b0 = &local_880;
    local_4f4 = *(int *)((long)local_7a8 + 0x2c);
    local_4f8 = (int)local_7a8[6];
    local_4fc = *(undefined4 *)((long)local_7a8 + 0x34);
    local_508 = (float *)(*local_7a8 + local_7a8[8] * (long)local_82c * local_7a8[2]);
    local_510 = local_7a8[2];
    local_514 = (undefined4)local_7a8[3];
    local_520 = local_7a8[4];
    local_4f0 = &local_880;
    local_2e8 = (long)local_4f4 * (long)local_4f8 * local_510;
    local_6a0 = &local_880;
    local_658 = &local_880;
    local_6c8 = &local_8d0;
    local_6d0 = &local_818;
    local_4d0 = (float *)((long)local_818 + local_7d8 * local_82c * local_808);
    local_4b8 = &local_8d0;
    local_2f8 = (long)local_7ec * (long)local_7e8 * local_808;
    local_848 = 0;
    local_84c = 0;
    local_850 = 0;
    local_854 = 0;
    local_868 = 0;
    local_870 = 0;
    local_878 = 0;
    local_880 = 0;
    local_8b0 = local_7f8;
    local_2ec = 0x10;
    local_2fc = 0x10;
    local_4bc = local_7ec;
    local_4c0 = local_7e8;
    local_4c4 = local_7e4;
    local_4d8 = local_808;
    local_4dc = local_800;
    local_4e8 = local_7f8;
    local_6bc = local_82c;
    local_6bd = 1;
    local_6d4 = local_82c;
    local_6d5 = 1;
    local_840 = 0;
    local_858 = 0;
    local_588 = &local_8d0;
    local_648 = &local_8d0;
    local_8d0 = 0;
    local_8c0 = 0;
    local_8b8 = 0;
    local_8a8 = 0;
    local_8a4 = 0;
    local_8a0 = 0;
    local_89c = 0;
    local_898 = 0;
    local_890 = 0;
    local_8c8 = 0;
    local_888 = local_4d0;
    local_838 = local_508;
    for (local_8d4 = 0; local_8d4 < local_7cc; local_8d4 = local_8d4 + 1) {
      *local_888 = *local_838 * *local_838;
      local_838 = local_838 + 1;
      local_888 = local_888 + 1;
    }
    local_1a8 = local_648;
    local_188 = local_658;
    local_860 = local_520;
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    local_788 = &local_920;
    local_920 = (undefined4 *)0x0;
    local_918 = (int *)0x0;
    local_910 = 0;
    local_908 = 0;
    local_900 = (long *)0x0;
    local_8f8 = 0;
    local_8f4 = 0;
    local_8f0 = 0;
    local_8ec = 0;
    local_8e8 = 0;
    local_8e0 = 0;
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff204,in_stack_fffffffffffff200),
                (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),(int)in_stack_fffffffffffff1f8,
                (int)((ulong)in_stack_fffffffffffff1f0 >> 0x20),in_stack_fffffffffffff1e8,
                (Allocator *)in_stack_fffffffffffff1e0);
    local_778 = &local_920;
    if (local_920 != (undefined4 *)0x0) {
      local_530 = local_778;
    }
    local_c99 = local_920 != (undefined4 *)0x0 && local_8e0 * local_8e8 != 0;
    if (local_c99) {
      local_568 = &local_920;
      local_56c = 0;
      local_570 = (int)local_8e0 * local_8e8;
      local_578 = local_920;
      for (local_57c = 0; local_57c < local_570; local_57c = local_57c + 1) {
        *local_578 = 0;
        local_578 = local_578 + 1;
      }
      local_924 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
                  (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_540 = local_568;
      for (local_928 = 0; local_928 < local_7bc; local_928 = local_928 + 1) {
        for (local_92c = local_928 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_92c <= local_928 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_92c = local_92c + 1) {
          if ((-1 < local_92c) && (local_92c < local_7bc)) {
            local_6e0 = &local_980;
            local_6e8 = &local_818;
            local_498 = (float *)((long)local_818 + local_7d8 * local_92c * local_808);
            local_480 = &local_980;
            local_308 = (long)local_7ec * (long)local_7e8 * local_808;
            local_6a8 = &local_980;
            local_638 = &local_980;
            local_6f8 = &local_9d0;
            local_700 = &local_920;
            local_460 = (float *)((long)local_920 + local_8e0 * local_928 * local_910);
            local_448 = &local_9d0;
            local_318 = (long)local_8f4 * (long)local_8f0 * local_910;
            local_590 = &local_9d0;
            local_628 = &local_9d0;
            local_948 = 0;
            local_94c = 0;
            local_950 = 0;
            local_954 = 0;
            local_960 = local_7f8;
            local_968 = 0;
            local_970 = 0;
            local_978 = 0;
            local_980 = 0;
            local_9b0 = local_900;
            local_30c = 0x10;
            local_31c = 0x10;
            local_44c = local_8f4;
            local_450 = local_8f0;
            local_454 = local_8ec;
            local_468 = local_910;
            local_46c = local_908;
            local_478 = local_900;
            local_484 = local_7ec;
            local_488 = local_7e8;
            local_48c = local_7e4;
            local_4a0 = local_808;
            local_4a4 = local_800;
            local_4b0 = local_7f8;
            local_6ec = local_92c;
            local_6ed = 1;
            local_704 = local_928;
            local_705 = 1;
            local_940 = 0;
            local_958 = 0;
            local_9d0 = 0;
            local_9c0 = 0;
            local_9b8 = 0;
            local_9a8 = 0;
            local_9a4 = 0;
            local_9a0 = 0;
            local_99c = 0;
            local_998 = 0;
            local_990 = 0;
            local_9c8 = 0;
            local_988 = local_460;
            local_938 = local_498;
            for (local_9d4 = 0; local_1e8 = local_628, local_1c8 = local_638, local_9d4 < local_7cc;
                local_9d4 = local_9d4 + 1) {
              *local_988 = *local_938 + *local_988;
              local_938 = local_938 + 1;
              local_988 = local_988 + 1;
            }
          }
        }
        local_710 = &local_a28;
        local_414 = *(int *)((long)local_7a8 + 0x2c);
        local_418 = (int)local_7a8[6];
        local_41c = *(undefined4 *)((long)local_7a8 + 0x34);
        local_9e0 = (float *)(*local_7a8 + local_7a8[8] * (long)local_928 * local_7a8[2]);
        local_430 = local_7a8[2];
        local_434 = (undefined4)local_7a8[3];
        local_440 = local_7a8[4];
        local_410 = &local_a28;
        local_328 = (long)local_414 * (long)local_418 * local_430;
        local_598 = &local_a28;
        local_618 = &local_a28;
        local_728 = &local_a78;
        local_730 = &local_920;
        local_a30 = (float *)((long)local_920 + local_8e0 * local_928 * local_910);
        local_3d8 = &local_a78;
        local_338 = (long)local_8f4 * (long)local_8f0 * local_910;
        local_5a0 = &local_a78;
        local_608 = &local_a78;
        local_9f0 = 0;
        local_9f4 = 0;
        local_9f8 = 0;
        local_9fc = 0;
        local_a10 = 0;
        local_a18 = 0;
        local_a20 = 0;
        local_a28 = 0;
        local_a58 = local_900;
        local_32c = 0x10;
        local_33c = 0x10;
        local_3dc = local_8f4;
        local_3e0 = local_8f0;
        local_3e4 = local_8ec;
        local_3f8 = local_910;
        local_3fc = local_908;
        local_408 = local_900;
        local_71c = local_928;
        local_71d = 1;
        local_734 = local_928;
        local_735 = 1;
        local_9e8 = 0;
        local_a00 = 0;
        local_a78 = 0;
        local_a68 = 0;
        local_a60 = 0;
        local_a50 = 0;
        local_a4c = 0;
        local_a48 = 0;
        local_a44 = 0;
        local_a40 = 0;
        local_a38 = 0;
        local_a70 = 0;
        local_428 = local_9e0;
        local_3f0 = local_a30;
        local_228 = local_608;
        local_208 = local_618;
        local_a08 = local_440;
        for (local_a7c = 0; local_a7c < local_7cc; local_a7c = local_a7c + 1) {
          fVar3 = *local_9e0;
          dVar1 = std::pow((double)(ulong)(uint)(*(float *)((long)in_RDI +
                                                           *(long *)(*in_RDI + -0x18) + 0xe0) +
                                                local_924 * *local_a30),
                           (double)((ulong)*(uint *)((long)in_RDI +
                                                    *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                   0x8000000080000000));
          *local_9e0 = fVar3 * SUB84(dVar1,0);
          local_a30 = local_a30 + 1;
          local_9e0 = local_9e0 + 1;
        }
      }
      local_828 = 0;
    }
    else {
      local_794 = -100;
      local_828 = 1;
    }
    local_5f8 = &local_920;
    local_248 = local_5f8;
    if (local_918 != (int *)0x0) {
      local_24c = 0xffffffff;
      LOCK();
      local_250 = *local_918;
      *local_918 = *local_918 + -1;
      UNLOCK();
      if (local_250 == 1) {
        if (local_900 == (long *)0x0) {
          local_60 = local_920;
          if (local_920 != (undefined4 *)0x0) {
            free(local_920);
          }
        }
        else {
          (**(code **)(*local_900 + 0x18))(local_900,local_920);
        }
      }
    }
    local_920 = (undefined4 *)0x0;
    local_910 = 0;
    local_908 = 0;
    local_8f8 = 0;
    local_8f4 = 0;
    local_8f0 = 0;
    local_8ec = 0;
    local_8e8 = 0;
    local_8e0 = 0;
    local_918 = (int *)0x0;
joined_r0x0102f8dc:
    if (local_828 != 0) goto LAB_0102fa24;
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
    local_a80 = local_7b4;
    local_a84 = local_7b8;
    local_558 = &local_ad0;
    local_560 = &local_818;
    local_ad0 = local_818;
    local_ac8 = local_810;
    local_ac0 = local_808;
    local_ab8 = local_800;
    local_ab0 = local_7f8;
    local_aa8 = local_7f0;
    local_aa4 = local_7ec;
    local_aa0 = local_7e8;
    local_a9c = local_7e4;
    local_a98 = local_7e0;
    local_a90 = local_7d8;
    if (local_810 != (int *)0x0) {
      local_c = 1;
      LOCK();
      local_10 = *local_810;
      *local_810 = *local_810 + 1;
      UNLOCK();
    }
    local_ad4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
    local_8 = local_558;
    if (local_ad4 < 1) {
LAB_0102ea46:
      local_b1c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_b1c = local_b1c * local_b1c;
      local_b20 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) / (float)local_b1c;
      std::allocator<int>::allocator((allocator<int> *)0x102eab1);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0);
      std::allocator<int>::~allocator((allocator<int> *)0x102eadd);
      local_b48 = std::vector<int,_std::allocator<int>_>::operator[](&local_b38,0);
      local_b4c = 0;
      local_b50 = 0;
      local_b54 = local_7b4 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      for (local_b58 = 0; local_b58 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_b58 = local_b58 + 1) {
        for (local_b5c = 0; local_b5c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            local_b5c = local_b5c + 1) {
          local_b48[local_b4c] = local_b50;
          local_b4c = local_b4c + 1;
          local_b50 = local_b50 + 1;
        }
        local_b50 = local_b54 + local_b50;
      }
      for (local_b60 = 0; local_b60 < local_7bc; local_b60 = local_b60 + 1) {
        local_740 = &local_bb0;
        local_3a4 = *(int *)((long)local_7a8 + 0x2c);
        local_3a8 = (int)local_7a8[6];
        local_3ac = *(undefined4 *)((long)local_7a8 + 0x34);
        local_b68 = *local_7a8 + local_7a8[8] * (long)local_b60 * local_7a8[2];
        local_3c0 = local_7a8[2];
        local_3c4 = (undefined4)local_7a8[3];
        local_3d0 = local_7a8[4];
        local_3a0 = &local_bb0;
        local_348 = (long)local_3a4 * (long)local_3a8 * local_3c0;
        local_5a8 = &local_bb0;
        local_5e8 = &local_bb0;
        local_34c = 0x10;
        local_74c = local_b60;
        local_74d = 1;
        local_bb0 = 0;
        local_ba0 = 0;
        local_b98 = 0;
        local_b88 = 0;
        local_b84 = 0;
        local_b80 = 0;
        local_b7c = 0;
        local_b78 = 0;
        local_b70 = 0;
        local_ba8 = 0;
        local_758 = &local_bf8;
        local_760 = &local_ad0;
        local_380 = (void *)((long)local_ad0 + local_a90 * local_b60 * local_ac0);
        local_368 = &local_bf8;
        local_bf0 = (int *)0x0;
        local_be8 = local_ac0;
        local_be0 = local_ab8;
        local_bd8 = local_ab0;
        local_bcc = local_aa4;
        local_bc8 = local_aa0;
        local_bc4 = 1;
        local_bc0 = local_a9c;
        local_358 = (long)local_aa4 * (long)local_aa0 * local_ac0;
        local_bb8 = (local_358 + 0xfU & 0xfffffffffffffff0) / local_ac0;
        local_bd0 = local_aa8 + -1;
        if (local_aa8 == 4) {
          local_bb8 = (long)local_aa4 * (long)local_aa0;
        }
        local_35c = 0x10;
        local_374 = local_a9c;
        local_388 = local_ac0;
        local_38c = local_ab8;
        local_398 = local_ab0;
        local_764 = local_b60;
        local_765 = 1;
        local_3b8 = local_b68;
        local_268 = local_5e8;
        local_bf8 = local_380;
        local_b90 = local_3d0;
        for (local_bfc = 0; local_bfc < local_a84; local_bfc = local_bfc + 1) {
          for (local_c00 = 0; local_c00 < local_a80; local_c00 = local_c00 + 1) {
            local_548 = &local_bf8;
            local_54c = local_bfc;
            local_c0c = 0.0;
            for (local_c10 = 0; local_c10 < local_b1c; local_c10 = local_c10 + 1) {
              local_c0c = *(float *)((long)local_bf8 +
                                    (long)local_b48[local_c10] * 4 +
                                    (long)local_c00 * 4 +
                                    (long)local_bcc * (long)local_bfc * local_be8) + local_c0c;
            }
            fVar3 = *(float *)(local_b68 + (long)local_c00 * 4);
            dVar1 = std::pow((double)(ulong)(uint)(*(float *)((long)in_RDI +
                                                             *(long *)(*in_RDI + -0x18) + 0xe0) +
                                                  local_b20 * local_c0c),
                             (double)((ulong)*(uint *)((long)in_RDI +
                                                      *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                     0x8000000080000000));
            *(float *)(local_b68 + (long)local_c00 * 4) = fVar3 * SUB84(dVar1,0);
          }
          local_b68 = local_b68 + (long)local_a80 * 4;
        }
        ppvVar2 = &local_bf8;
        local_5d8 = ppvVar2;
        local_288 = ppvVar2;
        if (local_bf0 != (int *)0x0) {
          local_28c = 0xffffffff;
          LOCK();
          local_290 = *local_bf0;
          *local_bf0 = *local_bf0 + -1;
          UNLOCK();
          if (local_290 == 1) {
            if (local_bd8 == (long *)0x0) {
              local_40 = local_bf8;
              if (local_bf8 != (void *)0x0) {
                free(local_bf8);
              }
            }
            else {
              (**(code **)(*local_bd8 + 0x18))(local_bd8,local_bf8);
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        ppvVar2[2] = (void *)0x0;
        *(undefined4 *)(ppvVar2 + 3) = 0;
        *(undefined4 *)(ppvVar2 + 5) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
        *(undefined4 *)(ppvVar2 + 6) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
        *(undefined4 *)(ppvVar2 + 7) = 0;
        ppvVar2[8] = (void *)0x0;
        ppvVar2[1] = (void *)0x0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1e0);
      local_828 = 0;
    }
    else {
      local_b18 = *local_7b0;
      local_b08 = *(undefined4 *)(local_7b0 + 2);
      uStack_b04 = *(undefined4 *)((long)local_7b0 + 0x14);
      uStack_b00 = *(undefined4 *)(local_7b0 + 3);
      uStack_afc = *(undefined4 *)((long)local_7b0 + 0x1c);
      local_af8 = local_7b0[4];
      uStack_af0 = local_7b0[5];
      local_ae8 = local_7b0[6];
      uStack_ae0 = local_7b0[7];
      uStack_b10 = local_7b0[2];
      copy_make_border(in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                       (int)((ulong)in_stack_fffffffffffff210 >> 0x20),
                       (int)in_stack_fffffffffffff210,in_stack_fffffffffffff20c,
                       in_stack_fffffffffffff208,in_stack_fffffffffffff230,in_stack_fffffffffffff204
                       ,in_stack_fffffffffffff238);
      local_780 = &local_ad0;
      if (local_ad0 != (void *)0x0) {
        local_528 = local_780;
      }
      if (local_ad0 != (void *)0x0 && local_a90 * local_a98 != 0) {
        local_7b4 = local_aa4;
        local_7b8 = local_aa0;
        goto LAB_0102ea46;
      }
      local_794 = -100;
      local_828 = 1;
    }
    ppvVar2 = &local_ad0;
    local_5c8 = ppvVar2;
    local_2a8 = ppvVar2;
    if (local_ac8 != (int *)0x0) {
      local_2ac = 0xffffffff;
      LOCK();
      local_2b0 = *local_ac8;
      *local_ac8 = *local_ac8 + -1;
      UNLOCK();
      if (local_2b0 == 1) {
        if (local_ab0 == (long *)0x0) {
          local_30 = local_ad0;
          if (local_ad0 != (void *)0x0) {
            free(local_ad0);
          }
        }
        else {
          (**(code **)(*local_ab0 + 0x18))(local_ab0,local_ad0);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
    goto joined_r0x0102f8dc;
  }
  local_794 = 0;
  local_828 = 1;
LAB_0102fa24:
  ppvVar2 = &local_818;
  if (local_810 != (int *)0x0) {
    local_2cc = 0xffffffff;
    LOCK();
    local_2d0 = *local_810;
    *local_810 = *local_810 + -1;
    UNLOCK();
    if (local_2d0 == 1) {
      local_5b8 = ppvVar2;
      local_2c8 = ppvVar2;
      if (local_7f8 == (long *)0x0) {
        local_20 = local_818;
        if (local_818 != (void *)0x0) {
          free(local_818);
        }
      }
      else {
        (**(code **)(*local_7f8 + 0x18))(local_7f8,local_818);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_794;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}